

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O0

type unodb::qsbr_state::dec_thread_count_and_threads_in_previous_epoch(type word)

{
  qsbr_epoch other;
  bool bVar1;
  qsbr_thread_count_type qVar2;
  qsbr_thread_count_type qVar3;
  qsbr_epoch local_19;
  type local_18;
  unsigned_long_long result;
  type word_local;
  
  result = word;
  assert_invariants(word);
  qVar2 = get_thread_count(result);
  if (qVar2 == 0) {
    __assert_fail("get_thread_count(word) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x144,
                  "static type unodb::qsbr_state::dec_thread_count_and_threads_in_previous_epoch(type)"
                 );
  }
  qVar2 = get_threads_in_previous_epoch(result);
  if (qVar2 == 0) {
    __assert_fail("get_threads_in_previous_epoch(word) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x145,
                  "static type unodb::qsbr_state::dec_thread_count_and_threads_in_previous_epoch(type)"
                 );
  }
  local_18 = result - 0x100000001;
  assert_invariants(local_18);
  local_19 = get_epoch(result);
  other = get_epoch(local_18);
  bVar1 = detail::qsbr_epoch::operator==(&local_19,other);
  if (!bVar1) {
    __assert_fail("get_epoch(word) == get_epoch(result)",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x14a,
                  "static type unodb::qsbr_state::dec_thread_count_and_threads_in_previous_epoch(type)"
                 );
  }
  qVar2 = get_threads_in_previous_epoch(result);
  qVar3 = get_threads_in_previous_epoch(local_18);
  if (qVar2 - 1 == qVar3) {
    qVar2 = get_thread_count(result);
    qVar3 = get_thread_count(local_18);
    if (qVar2 - 1 == qVar3) {
      return local_18;
    }
    __assert_fail("get_thread_count(word) - 1 == get_thread_count(result)",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x14d,
                  "static type unodb::qsbr_state::dec_thread_count_and_threads_in_previous_epoch(type)"
                 );
  }
  __assert_fail("get_threads_in_previous_epoch(word) - 1 == get_threads_in_previous_epoch(result)",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                ,0x14c,
                "static type unodb::qsbr_state::dec_thread_count_and_threads_in_previous_epoch(type)"
               );
}

Assistant:

[[nodiscard, gnu::const]] static constexpr type
  dec_thread_count_and_threads_in_previous_epoch(type word) noexcept {
    assert_invariants(word);
    UNODB_DETAIL_ASSERT(get_thread_count(word) > 0);
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(word) > 0);

    const auto result = word - one_thread_and_one_in_previous;

    assert_invariants(result);
    UNODB_DETAIL_ASSERT(get_epoch(word) == get_epoch(result));
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(word) - 1 ==
                        get_threads_in_previous_epoch(result));
    UNODB_DETAIL_ASSERT(get_thread_count(word) - 1 == get_thread_count(result));

    return result;
  }